

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall cmCTest::GetSubmitURL_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  allocator<char> local_109;
  string password;
  string user;
  string location;
  string site;
  string method;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  static_string_view local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&method,"SubmitURL",(allocator<char> *)&user);
  GetCTestConfiguration(__return_storage_ptr__,this,&method);
  std::__cxx11::string::~string((string *)&method);
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&user,"DropMethod",(allocator<char> *)&password);
    GetCTestConfiguration(&method,this,&user);
    std::__cxx11::string::~string((string *)&user);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&password,"DropSiteUser",(allocator<char> *)&site);
    GetCTestConfiguration(&user,this,&password);
    std::__cxx11::string::~string((string *)&password);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&site,"DropSitePassword",(allocator<char> *)&location);
    GetCTestConfiguration(&password,this,&site);
    std::__cxx11::string::~string((string *)&site);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"DropSite",(allocator<char> *)&local_68);
    GetCTestConfiguration(&site,this,&location);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"DropLocation",(allocator<char> *)&local_48);
    GetCTestConfiguration(&location,this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (method._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"http",&local_109);
    }
    else {
      std::__cxx11::string::string((string *)&local_48,(string *)&method);
    }
    local_28.super_string_view._M_len = 3;
    local_28.super_string_view._M_str = "://";
    cmStrCat<std::__cxx11::string,cm::static_string_view>(&local_68,&local_48,&local_28);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    if (user._M_string_length != 0) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      if (password._M_string_length != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::~string((string *)&site);
    std::__cxx11::string::~string((string *)&password);
    std::__cxx11::string::~string((string *)&user);
    std::__cxx11::string::~string((string *)&method);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetSubmitURL()
{
  std::string url = this->GetCTestConfiguration("SubmitURL");
  if (url.empty()) {
    std::string method = this->GetCTestConfiguration("DropMethod");
    std::string user = this->GetCTestConfiguration("DropSiteUser");
    std::string password = this->GetCTestConfiguration("DropSitePassword");
    std::string site = this->GetCTestConfiguration("DropSite");
    std::string location = this->GetCTestConfiguration("DropLocation");

    url = cmStrCat(method.empty() ? "http" : method, "://"_s);
    if (!user.empty()) {
      url += user;
      if (!password.empty()) {
        url += ':';
        url += password;
      }
      url += '@';
    }
    url += site;
    url += location;
  }
  return url;
}